

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::pareto_dist<long_double>::icdf(pareto_dist<long_double> *this,result_type_conflict3 x)

{
  int *piVar1;
  param_type *in_RSI;
  param_type *in_RDI;
  double in_XMM0_Qa;
  double __x;
  double in_XMM1_Qa;
  longdouble in_stack_00000008;
  
  if ((in_stack_00000008 <= (longdouble)0) || ((longdouble)1 <= in_stack_00000008)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    in_RDI = (param_type *)std::numeric_limits<long_double>::quiet_NaN();
  }
  else if ((in_stack_00000008 != (longdouble)0) || (NAN(in_stack_00000008) || NAN((longdouble)0))) {
    if ((in_stack_00000008 != (longdouble)1) || (NAN(in_stack_00000008) || NAN((longdouble)1))) {
      __x = param_type::gamma(in_RDI,in_XMM0_Qa);
      std::pow(__x,in_XMM1_Qa);
      in_RDI = (param_type *)param_type::theta(&in_RDI->gamma_,in_RSI);
    }
    else {
      in_RDI = (param_type *)std::numeric_limits<long_double>::infinity();
    }
  }
  return &in_RDI->gamma_;
}

Assistant:

result_type icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return (math::pow((1 - x), -1 / P.gamma()) - 1) * P.theta();
    }